

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_structs.c
# Opt level: O3

ulp_ring_public_key * ulp_ring_alloc_public_key(size_t n)

{
  ulp_ring_public_key *__ptr;
  uint64_t *__ptr_00;
  uint64_t *__ptr_01;
  
  __ptr = (ulp_ring_public_key *)malloc(0x28);
  if (__ptr != (ulp_ring_public_key *)0x0) {
    __ptr->n = n;
    __ptr_00 = (uint64_t *)malloc(n << 3);
    __ptr->a = __ptr_00;
    __ptr_01 = (uint64_t *)malloc(n << 3);
    __ptr->p = __ptr_01;
    if (__ptr_00 != (uint64_t *)0x0 && __ptr_01 != (uint64_t *)0x0) {
      return __ptr;
    }
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr);
  }
  return (ulp_ring_public_key *)0x0;
}

Assistant:

ulp_ring_public_key* ulp_ring_alloc_public_key(size_t n) {
    ulp_ring_public_key* key = malloc(sizeof(ulp_ring_public_key));
    if(key == NULL)
        return NULL;
    key->n = n;
    key->a = malloc(n*sizeof(key->q));
    key->p = malloc(n*sizeof(key->q));
    if(key->a == NULL || key->p == NULL) {
        free(key->a);
        free(key->p);
        free(key);
        return NULL;
    }
    return key;
}